

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::piece_picker::dec_refcount_all(piece_picker *this,torrent_peer *peer)

{
  pointer ppVar1;
  int iVar2;
  piece_pos *i;
  pointer ppVar3;
  
  if (this->m_seeds < 1) {
    ppVar1 = (this->m_piece_map).
             super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             .
             super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar3 = (this->m_piece_map).
                  super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  .
                  super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1)
    {
      *(uint *)ppVar3 = *(uint *)ppVar3 & 0xfc000000 | *(uint *)ppVar3 - 1 & 0x3ffffff;
    }
  }
  else {
    iVar2 = this->m_seeds + -1;
    this->m_seeds = iVar2;
    if (iVar2 != 0) {
      return;
    }
  }
  this->m_dirty = true;
  return;
}

Assistant:

void piece_picker::dec_refcount_all(const aux::torrent_peer* peer)
	{
#ifdef TORRENT_EXPENSIVE_INVARIANT_CHECKS
		INVARIANT_CHECK;
#endif

		if (m_seeds > 0)
		{
			--m_seeds;
			if (m_seeds == 0)
			{
				// when m_seeds is decreased from 1 to 0
				// we may have to remove pieces that previously
				// didn't have any peers
				m_dirty = true;
			}
#ifdef TORRENT_DEBUG_REFCOUNTS
			for (std::vector<piece_pos>::iterator i = m_piece_map.begin()
				, end(m_piece_map.end()); i != end; ++i)
			{
				TORRENT_ASSERT(i->have_peers.count(peer) == 1);
				i->have_peers.erase(peer);
			}
#else
			TORRENT_UNUSED(peer);
#endif
			return;
		}
		TORRENT_ASSERT(m_seeds == 0);

		for (auto& i : m_piece_map)
		{
#ifdef TORRENT_DEBUG_REFCOUNTS
			TORRENT_ASSERT(i.have_peers.count(peer) == 1);
			i.have_peers.erase(peer);
#else
			TORRENT_UNUSED(peer);
#endif

			TORRENT_ASSERT(i.peer_count > 0);
			--i.peer_count;
		}

		m_dirty = true;
	}